

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int walDecodeFrame(Wal *pWal,u32 *piPage,u32 *pnTruncate,u8 *aData,u8 *aFrame)

{
  u32 *aIn;
  u32 uVar1;
  u32 uVar2;
  u32 uVar3;
  int iVar4;
  uint nativeCksum;
  
  iVar4 = 0;
  if (*(long *)(pWal->hdr).aSalt == *(long *)(aFrame + 8)) {
    uVar2 = sqlite3Get4byte(aFrame);
    if (uVar2 != 0) {
      aIn = (pWal->hdr).aFrameCksum;
      nativeCksum = (uint)((pWal->hdr).bigEndCksum == '\0');
      walChecksumBytes(nativeCksum,aFrame,8,aIn,aIn);
      walChecksumBytes(nativeCksum,aData,pWal->szPage,aIn,aIn);
      uVar1 = (pWal->hdr).aFrameCksum[0];
      uVar3 = sqlite3Get4byte(aFrame + 0x10);
      iVar4 = 0;
      if (uVar1 == uVar3) {
        uVar1 = (pWal->hdr).aFrameCksum[1];
        uVar3 = sqlite3Get4byte(aFrame + 0x14);
        if (uVar1 == uVar3) {
          *piPage = uVar2;
          uVar2 = sqlite3Get4byte(aFrame + 4);
          *pnTruncate = uVar2;
          iVar4 = 1;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

static int walDecodeFrame(
  Wal *pWal,                      /* The write-ahead log */
  u32 *piPage,                    /* OUT: Database page number for frame */
  u32 *pnTruncate,                /* OUT: New db size (or 0 if not commit) */
  u8 *aData,                      /* Pointer to page data (for checksum) */
  u8 *aFrame                      /* Frame data */
){
  int nativeCksum;                /* True for native byte-order checksums */
  u32 *aCksum = pWal->hdr.aFrameCksum;
  u32 pgno;                       /* Page number of the frame */
  assert( WAL_FRAME_HDRSIZE==24 );

  /* A frame is only valid if the salt values in the frame-header
  ** match the salt values in the wal-header. 
  */
  if( memcmp(&pWal->hdr.aSalt, &aFrame[8], 8)!=0 ){
    return 0;
  }

  /* A frame is only valid if the page number is creater than zero.
  */
  pgno = sqlite3Get4byte(&aFrame[0]);
  if( pgno==0 ){
    return 0;
  }

  /* A frame is only valid if a checksum of the WAL header,
  ** all prior frams, the first 16 bytes of this frame-header, 
  ** and the frame-data matches the checksum in the last 8 
  ** bytes of this frame-header.
  */
  nativeCksum = (pWal->hdr.bigEndCksum==SQLITE_BIGENDIAN);
  walChecksumBytes(nativeCksum, aFrame, 8, aCksum, aCksum);
  walChecksumBytes(nativeCksum, aData, pWal->szPage, aCksum, aCksum);
  if( aCksum[0]!=sqlite3Get4byte(&aFrame[16]) 
   || aCksum[1]!=sqlite3Get4byte(&aFrame[20]) 
  ){
    /* Checksum failed. */
    return 0;
  }

  /* If we reach this point, the frame is valid.  Return the page number
  ** and the new database size.
  */
  *piPage = pgno;
  *pnTruncate = sqlite3Get4byte(&aFrame[4]);
  return 1;
}